

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O0

Error __thiscall
asmjit::v1_14::RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder>::shareAssignmentAcrossSuccessors
          (RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *this,RABlock *block)

{
  uint uVar1;
  long lVar2;
  RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *pRVar3;
  bool bVar4;
  Error EVar5;
  RABlock **ppRVar6;
  uint *puVar7;
  long in_RSI;
  Error _err;
  RABlock *successor;
  const_iterator __end3;
  const_iterator __begin3;
  RABlocks *__range3;
  uint32_t sharedAssignmentId;
  RABlock *consecutive;
  undefined4 in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  ZoneVector<asmjit::v1_14::RABlock_*> *in_stack_ffffffffffffff18;
  RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *pRVar8;
  RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *this_00;
  long *local_b8;
  uint local_a4;
  
  if (1 < *(uint *)(in_RSI + 0x70)) {
    bVar4 = Support::test<asmjit::v1_14::RABlockFlags,asmjit::v1_14::RABlockFlags>
                      (*(RABlockFlags *)(in_RSI + 0xc),kHasConsecutive);
    if (bVar4) {
      ppRVar6 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[]
                          (in_stack_ffffffffffffff18,
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      pRVar8 = (RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *)*ppRVar6;
    }
    else {
      pRVar8 = (RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *)0x0;
    }
    local_a4 = 0xffffffff;
    lVar2 = *(long *)(in_RSI + 0x68);
    uVar1 = *(uint *)(in_RSI + 0x70);
    this_00 = pRVar8;
    for (local_b8 = *(long **)(in_RSI + 0x68); local_b8 != (long *)(lVar2 + (ulong)uVar1 * 8);
        local_b8 = local_b8 + 1) {
      pRVar3 = (RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *)*local_b8;
      if (pRVar3 != pRVar8) {
        if (*(int *)&pRVar3->field_0xb8 == -1) {
          if ((local_a4 == 0xffffffff) &&
             (EVar5 = newSharedAssignmentId
                                (this_00,(uint32_t *)
                                         CONCAT44(in_stack_ffffffffffffff14,
                                                  in_stack_ffffffffffffff10)), EVar5 != 0)) {
            return EVar5;
          }
          *(uint *)&pRVar3->field_0xb8 = local_a4;
        }
        else if (local_a4 == 0xffffffff) {
          local_a4 = *(uint *)&pRVar3->field_0xb8;
        }
        else {
          in_stack_ffffffffffffff14 = local_a4;
          puVar7 = ZoneVector<unsigned_int>::operator[]
                             ((ZoneVector<unsigned_int> *)this_00,
                              CONCAT44(local_a4,in_stack_ffffffffffffff10));
          *puVar7 = in_stack_ffffffffffffff14;
        }
      }
    }
  }
  return 0;
}

Assistant:

Error shareAssignmentAcrossSuccessors(RABlock* block) noexcept {
    if (block->successors().size() <= 1)
      return kErrorOk;

    RABlock* consecutive = block->consecutive();
    uint32_t sharedAssignmentId = Globals::kInvalidId;

    for (RABlock* successor : block->successors()) {
      if (successor == consecutive)
        continue;

      if (successor->hasSharedAssignmentId()) {
        if (sharedAssignmentId == Globals::kInvalidId)
          sharedAssignmentId = successor->sharedAssignmentId();
        else
          _sharedAssignmentsMap[successor->sharedAssignmentId()] = sharedAssignmentId;
      }
      else {
        if (sharedAssignmentId == Globals::kInvalidId)
          ASMJIT_PROPAGATE(newSharedAssignmentId(&sharedAssignmentId));
        successor->setSharedAssignmentId(sharedAssignmentId);
      }
    }
    return kErrorOk;
  }